

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall
dxil_spv::Converter::Impl::get_uav_image_format
          (Impl *this,ResourceKind resource_kind,ComponentType actual_component_type,
          AccessTracking *access_meta,ImageFormat *format)

{
  undefined8 uVar1;
  Builder *pBVar2;
  void *pvVar3;
  char local_1038 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  ImageFormat *format_local;
  AccessTracking *access_meta_local;
  ComponentType actual_component_type_local;
  ResourceKind resource_kind_local;
  Impl *this_local;
  
  if ((resource_kind == FeedbackTexture2D) || (resource_kind == FeedbackTexture2DArray)) {
    *format = ImageFormatR64ui;
    pBVar2 = builder(this);
    spv::Builder::addExtension(pBVar2,"SPV_EXT_shader_image_int64");
    pBVar2 = builder(this);
    spv::Builder::addCapability(pBVar2,CapabilityInt64ImageEXT);
  }
  else if (((resource_kind != RawBuffer) && (resource_kind != StructuredBuffer)) &&
          ((access_meta->has_read & 1U) != 0)) {
    if ((((this->options).typed_uav_read_without_format & 1U) == 0) ||
       ((access_meta->has_atomic & 1U) != 0)) {
      switch(actual_component_type) {
      case I32:
        *format = ImageFormatR32i;
        break;
      case U32:
        *format = ImageFormatR32ui;
        break;
      default:
        buffer._4088_8_ = get_thread_log_callback();
        if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
          fprintf(_stderr,
                  "[ERROR]: Reading from UAV, but component type does not conform to U32, I32, F32 or U64. typed_uav_read_without_format option must be enabled.\n"
                 );
          fflush(_stderr);
        }
        else {
          snprintf(local_1038,0x1000,
                   "Reading from UAV, but component type does not conform to U32, I32, F32 or U64. typed_uav_read_without_format option must be enabled.\n"
                  );
          uVar1 = buffer._4088_8_;
          pvVar3 = get_thread_log_callback_userdata();
          (*(code *)uVar1)(pvVar3,2,local_1038);
        }
        return false;
      case U64:
        *format = ImageFormatR64ui;
        pBVar2 = builder(this);
        spv::Builder::addExtension(pBVar2,"SPV_EXT_shader_image_int64");
        pBVar2 = builder(this);
        spv::Builder::addCapability(pBVar2,CapabilityInt64ImageEXT);
        break;
      case F32:
        *format = ImageFormatR32f;
      }
    }
    else {
      pBVar2 = builder(this);
      spv::Builder::addCapability(pBVar2,CapabilityStorageImageReadWithoutFormat);
      *format = ImageFormatUnknown;
    }
  }
  return true;
}

Assistant:

bool Converter::Impl::get_uav_image_format(DXIL::ResourceKind resource_kind,
                                           DXIL::ComponentType actual_component_type,
                                           const AccessTracking &access_meta,
                                           spv::ImageFormat &format)
{
	if (resource_kind == DXIL::ResourceKind::FeedbackTexture2D ||
	    resource_kind == DXIL::ResourceKind::FeedbackTexture2DArray)
	{
		format = spv::ImageFormatR64ui;
		builder().addExtension("SPV_EXT_shader_image_int64");
		builder().addCapability(spv::CapabilityInt64ImageEXT);
		return true;
	}
	else if (resource_kind != DXIL::ResourceKind::RawBuffer &&
	         resource_kind != DXIL::ResourceKind::StructuredBuffer)
	{
		// For any typed resource, we need to check if the resource is being read.
		// To avoid StorageReadWithoutFormat, we emit a format based on the component type.
		if (access_meta.has_read)
		{
			if (options.typed_uav_read_without_format && !access_meta.has_atomic)
			{
				builder().addCapability(spv::CapabilityStorageImageReadWithoutFormat);
				format = spv::ImageFormatUnknown;
			}
			else
			{
				switch (actual_component_type)
				{
				case DXIL::ComponentType::U32:
					format = spv::ImageFormatR32ui;
					break;

				case DXIL::ComponentType::I32:
					format = spv::ImageFormatR32i;
					break;

				case DXIL::ComponentType::F32:
					format = spv::ImageFormatR32f;
					break;

				case DXIL::ComponentType::U64:
					format = spv::ImageFormatR64ui;
					builder().addExtension("SPV_EXT_shader_image_int64");
					builder().addCapability(spv::CapabilityInt64ImageEXT);
					break;

				default:
					LOGE("Reading from UAV, but component type does not conform to U32, I32, F32 or U64. "
					     "typed_uav_read_without_format option must be enabled.\n");
					return false;
				}
			}
		}
	}

	return true;
}